

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  CppStringType CVar8;
  int32_t iVar9;
  uint32_t uVar10;
  int iVar11;
  MapFieldBase *this;
  Descriptor *pDVar12;
  size_t sVar13;
  size_t sVar14;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar15;
  int64_t iVar16;
  Message *pMVar17;
  undefined4 extraout_var_00;
  string *psVar18;
  undefined4 extraout_var_01;
  uint64_t uVar19;
  ulong uVar20;
  undefined4 extraout_var_02;
  ExtensionSet *this_00;
  Nonnull<const_char_*> pcVar21;
  undefined8 extraout_RAX;
  Reflection *this_01;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  Metadata MVar25;
  MapIterator iter;
  MapIterator end;
  undefined1 local_d0 [32];
  MapKey local_b0;
  MapValueConstRef local_98 [2];
  MapIterator local_78;
  
  MVar25 = Message::GetMetadata(message);
  this_01 = MVar25.reflection;
  if ((field->type_ == '\v') && (bVar5 = FieldDescriptor::is_map_message_type(field), bVar5)) {
    this = Reflection::GetMapData(this_01,message,field);
    bVar5 = MapFieldBase::IsMapValid(this);
    if (!bVar5) {
      sVar22 = 0;
LAB_0031f643:
      if (bVar5) {
        return sVar22;
      }
      goto LAB_0031f4aa;
    }
    MapIterator::MapIterator((MapIterator *)local_d0,message,field);
    MapIterator::MapIterator(&local_78,message,field);
    pDVar12 = FieldDescriptor::message_type(field);
    if ((long)pDVar12->field_count_ < 1) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,(long)pDVar12->field_count_,"index < field_count()");
    }
    else {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar21 != (Nonnull<const_char_*>)0x0) goto LAB_0031fe09;
    field_00 = pDVar12->fields_;
    pDVar12 = FieldDescriptor::message_type(field);
    if ((long)pDVar12->field_count_ < 2) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)pDVar12->field_count_,"index < field_count()");
    }
    else {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      pFVar2 = pDVar12->fields_;
      MapFieldBase::MapBegin(this,(MapIterator *)local_d0);
      MapFieldBase::MapEnd(this,&local_78);
      bVar6 = MapFieldBase::EqualIterator
                        ((MapFieldBase *)local_d0._24_8_,(MapIterator *)local_d0,&local_78);
      if (bVar6) {
        sVar22 = 0;
      }
      else {
        sVar22 = 0;
        do {
          sVar13 = MapKeyDataOnlyByteSize(field_00,&local_b0);
          sVar14 = MapValueRefDataOnlyByteSize(pFVar2 + 1,local_98);
          uVar7 = (int)sVar14 + (int)sVar13 + 2U | 1;
          iVar11 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
            }
          }
          sVar22 = sVar22 + sVar13 + sVar14 + 2 + (ulong)(iVar11 * 9 + 0x49U >> 6);
          MapFieldBase::IncreaseIterator((MapFieldBase *)local_d0._24_8_,(MapIterator *)local_d0);
          bVar6 = MapFieldBase::EqualIterator
                            ((MapFieldBase *)local_d0._24_8_,(MapIterator *)local_d0,&local_78);
        } while (!bVar6);
      }
      goto LAB_0031f643;
    }
LAB_0031fe16:
    FieldDataOnlyByteSize();
    message = (Message *)pDVar12;
LAB_0031fe23:
    FieldDataOnlyByteSize();
LAB_0031fe30:
    FieldDataOnlyByteSize();
LAB_0031fe3d:
    FieldDataOnlyByteSize();
LAB_0031fe4a:
    FieldDataOnlyByteSize();
LAB_0031fe57:
    FieldDataOnlyByteSize();
LAB_0031fe64:
    FieldDataOnlyByteSize();
LAB_0031fe71:
    FieldDataOnlyByteSize();
LAB_0031fe7e:
    FieldDataOnlyByteSize();
LAB_0031fe8b:
    FieldDataOnlyByteSize();
    if ((Message *)local_d0._0_8_ != message) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  sVar22 = 0;
LAB_0031f4aa:
  bVar1 = field->field_0x1;
  bVar5 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar5) {
    pcVar21 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar5,0xbf < bVar1,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar21 != (Nonnull<const_char_*>)0x0) {
    FieldDataOnlyByteSize();
    pDVar12 = (Descriptor *)message;
LAB_0031fe09:
    FieldDataOnlyByteSize();
    goto LAB_0031fe16;
  }
  if ((field->field_0x1 & 0x20) == 0) {
    uVar23 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar5 = Reflection::HasField(this_01,message,field);
      uVar23 = (ulong)bVar5;
    }
  }
  else {
    uVar7 = Reflection::FieldSize(this_01,message,field);
    uVar23 = (ulong)uVar7;
  }
  switch(field->type_) {
  case '\x01':
  case '\x06':
  case '\x10':
    sVar22 = sVar22 + uVar23 * 8;
    break;
  case '\x02':
  case '\a':
  case '\x0f':
    sVar22 = sVar22 + uVar23 * 4;
    break;
  case '\x03':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          uVar20 = Reflection::GetRepeatedInt64(this_01,message,field,(int)uVar24);
          lVar4 = 0x3f;
          if ((uVar20 | 1) != 0) {
            for (; (uVar20 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar22 = sVar22 + ((int)lVar4 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      uVar23 = Reflection::GetInt64(this_01,message,field);
LAB_0031f8a3:
      uVar23 = uVar23 | 1;
LAB_0031f8a7:
      lVar4 = 0x3f;
      if (uVar23 != 0) {
        for (; uVar23 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      iVar11 = (int)lVar4;
      goto LAB_0031fc71;
    }
    goto LAB_0031fe64;
  case '\x04':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          uVar19 = Reflection::GetRepeatedUInt64(this_01,message,field,(int)uVar24);
          lVar4 = 0x3f;
          if ((uVar19 | 1) != 0) {
            for (; (uVar19 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar22 = sVar22 + ((int)lVar4 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      uVar23 = Reflection::GetUInt64(this_01,message,field);
      goto LAB_0031f8a3;
    }
    goto LAB_0031fe71;
  case '\x05':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          uVar7 = Reflection::GetRepeatedInt32(this_01,message,field,(int)uVar24);
          lVar4 = 0x3f;
          if ((long)(int)(uVar7 | 1) != 0) {
            for (; (ulong)(long)(int)(uVar7 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar22 = sVar22 + ((int)lVar4 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      uVar7 = Reflection::GetInt32(this_01,message,field);
      uVar23 = (ulong)(int)(uVar7 | 1);
      goto LAB_0031f8a7;
    }
    goto LAB_0031fe4a;
  case '\b':
    sVar22 = sVar22 + uVar23;
    break;
  case '\t':
  case '\f':
    CVar8 = FieldDescriptor::cpp_string_type(field);
    if (CVar8 == kCord) {
      if (uVar23 != 0) {
        do {
          Reflection::GetCord((Reflection *)local_d0,(Message *)this_01,(FieldDescriptor *)message);
          if (((long)local_d0[0] & 1U) == 0) {
            uVar24 = (ulong)(long)local_d0[0] >> 1;
          }
          else {
            uVar24 = *(ulong *)local_d0._8_8_;
          }
          uVar7 = (uint)uVar24 | 1;
          iVar11 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
            }
          }
          sVar22 = sVar22 + uVar24 + (ulong)(iVar11 * 9 + 0x49U >> 6);
          absl::lts_20250127::Cord::~Cord((Cord *)local_d0);
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
    }
    else if (uVar23 != 0) {
      pDVar12 = (Descriptor *)(local_d0 + 0x10);
      uVar24 = 0;
      do {
        local_d0._8_8_ = (UntypedMapBase *)0x0;
        local_d0[0x10] = '\0';
        bVar1 = field->field_0x1;
        bVar5 = (bool)((bVar1 & 0x20) >> 5);
        local_d0._0_8_ = pDVar12;
        if (0xbf < bVar1 == bVar5) {
          pcVar21 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar21 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar21);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_78);
        }
        if ((field->field_0x1 & 0x20) == 0) {
          psVar18 = Reflection::GetStringReference(this_01,message,field,(string *)local_d0);
        }
        else {
          psVar18 = Reflection::GetRepeatedStringReference
                              (this_01,message,field,(int)uVar24,(string *)local_d0);
        }
        sVar3 = psVar18->_M_string_length;
        if ((Descriptor *)local_d0._0_8_ != pDVar12) {
          operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
        }
        uVar7 = (uint)sVar3 | 1;
        iVar11 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        sVar22 = sVar22 + sVar3 + (ulong)(iVar11 * 9 + 0x49U >> 6);
        uVar24 = uVar24 + 1;
      } while (uVar23 != uVar24);
    }
    break;
  case '\n':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          pMVar17 = Reflection::GetRepeatedMessage(this_01,message,field,(int)uVar24);
          iVar11 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
          sVar22 = sVar22 + CONCAT44(extraout_var_01,iVar11);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      pMVar17 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
      iVar11 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
      uVar23 = CONCAT44(extraout_var,iVar11);
      goto LAB_0031fc7a;
    }
    goto LAB_0031fe3d;
  case '\v':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 != (Nonnull<const_char_*>)0x0) goto LAB_0031fe8b;
    if ((field->field_0x1 & 0x20) != 0) {
      if (uVar23 == 0) {
        return sVar22;
      }
      uVar24 = 0;
      do {
        pMVar17 = Reflection::GetRepeatedMessage(this_01,message,field,(int)uVar24);
        uVar7 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
        iVar11 = 0x1f;
        if ((uVar7 | 1) != 0) {
          for (; (uVar7 | 1) >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        sVar22 = sVar22 + CONCAT44(extraout_var_02,uVar7) + (ulong)(iVar11 * 9 + 0x49U >> 6);
        uVar24 = uVar24 + 1;
      } while (uVar23 != uVar24);
      return sVar22;
    }
    if ((field->field_0x1 & 8) == 0) {
      pMVar17 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
      iVar11 = (*(pMVar17->super_MessageLite)._vptr_MessageLite[3])(pMVar17);
      uVar23 = CONCAT44(extraout_var_00,iVar11);
    }
    else {
      this_00 = Reflection::GetExtensionSet(this_01,message);
      uVar23 = ExtensionSet::GetMessageByteSizeLong(this_00,field->number_);
    }
    sVar22 = sVar22 + uVar23;
LAB_0031fc6b:
    uVar7 = (uint)uVar23 | 1;
    iVar11 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
LAB_0031fc71:
    uVar23 = (ulong)(iVar11 * 9 + 0x49U >> 6);
LAB_0031fc7a:
    sVar22 = sVar22 + uVar23;
    break;
  case '\r':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          uVar10 = Reflection::GetRepeatedUInt32(this_01,message,field,(int)uVar24);
          iVar11 = 0x1f;
          if ((uVar10 | 1) != 0) {
            for (; (uVar10 | 1) >> iVar11 == 0; iVar11 = iVar11 + -1) {
            }
          }
          sVar22 = sVar22 + (iVar11 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      uVar10 = Reflection::GetUInt32(this_01,message,field);
      uVar23 = (ulong)uVar10;
      goto LAB_0031fc6b;
    }
    goto LAB_0031fe30;
  case '\x0e':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          pEVar15 = Reflection::GetRepeatedEnum(this_01,message,field,(int)uVar24);
          uVar20 = (long)pEVar15->number_ | 1;
          lVar4 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar22 = sVar22 + ((int)lVar4 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      pEVar15 = Reflection::GetEnum(this_01,message,field);
      uVar23 = (ulong)pEVar15->number_;
      goto LAB_0031f8a3;
    }
    goto LAB_0031fe57;
  case '\x11':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          iVar9 = Reflection::GetRepeatedInt32(this_01,message,field,(int)uVar24);
          uVar7 = iVar9 >> 0x1f ^ iVar9 * 2 | 1;
          iVar11 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
            }
          }
          sVar22 = sVar22 + (iVar11 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      iVar9 = Reflection::GetInt32(this_01,message,field);
      uVar7 = iVar9 >> 0x1f ^ iVar9 * 2 | 1;
      iVar11 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      goto LAB_0031fc71;
    }
    goto LAB_0031fe23;
  case '\x12':
    bVar1 = field->field_0x1;
    bVar5 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar5) {
      pcVar21 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar5,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar21 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (uVar23 == 0) {
          return sVar22;
        }
        uVar24 = 0;
        do {
          iVar16 = Reflection::GetRepeatedInt64(this_01,message,field,(int)uVar24);
          uVar20 = iVar16 >> 0x3f ^ iVar16 * 2 | 1;
          lVar4 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar22 = sVar22 + ((int)lVar4 * 9 + 0x49U >> 6);
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
        return sVar22;
      }
      iVar16 = Reflection::GetInt64(this_01,message,field);
      uVar23 = iVar16 >> 0x3f ^ iVar16 * 2;
      goto LAB_0031f8a3;
    }
    goto LAB_0031fe7e;
  }
  return sVar22;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (size_t j = 0; j < count; j++) {                                  \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)

    case FieldDescriptor::TYPE_MESSAGE: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; ++j) {
          data_size += WireFormatLite::MessageSize(
              message_reflection->GetRepeatedMessage(message, field, j));
        }
        break;
      }
      if (field->is_extension()) {
        data_size += WireFormatLite::LengthDelimitedSize(
            message_reflection->GetExtensionSet(message).GetMessageByteSizeLong(
                field->number()));
        break;
      }
      data_size += WireFormatLite::MessageSize(
          message_reflection->GetMessage(message, field));
      break;
    }

#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        for (size_t j = 0; j < count; j++) {
          absl::Cord value = message_reflection->GetCord(message, field);
          data_size += WireFormatLite::StringSize(value);
        }
        break;
      }
      for (size_t j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}